

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnndec.c
# Opt level: O0

char * rnndec_decodeval(rnndeccontext *ctx,rnntypeinfo *ti,uint64_t value,int width)

{
  byte bVar1;
  int iVar2;
  ulong value_00;
  char *pcVar3;
  long lVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  anon_union_8_3_4e90a3e7 val;
  char *subval;
  uint64_t sval;
  uint64_t mask;
  char *tmp;
  rnnbitfield **pprStack_58;
  int bitfieldsnum;
  rnnbitfield **bitfields;
  rnnvalue **pprStack_48;
  int valsnum;
  rnnvalue **vals;
  rnndeccontext *prStack_38;
  int i;
  char *res;
  uint64_t uStack_28;
  int width_local;
  uint64_t value_local;
  rnntypeinfo *ti_local;
  rnndeccontext *ctx_local;
  
  prStack_38 = (rnndeccontext *)0x0;
  res._4_4_ = width;
  uStack_28 = value;
  value_local = (uint64_t)ti;
  ti_local = (rnntypeinfo *)ctx;
  if (ti == (rnntypeinfo *)0x0) goto switchD_002538c3_default;
  if (ti->shr != 0) {
    uStack_28 = value << ((byte)ti->shr & 0x3f);
  }
  if (ti->add != 0) {
    uStack_28 = (long)ti->add + uStack_28;
  }
  bVar1 = (byte)width;
  switch(ti->type) {
  case RNN_TTYPE_INLINE_ENUM:
    pprStack_48 = ti->vals;
    bitfields._4_4_ = ti->valsnum;
    goto LAB_002538fb;
  case RNN_TTYPE_INLINE_BITSET:
    pprStack_58 = ti->bitfields;
    tmp._4_4_ = ti->bitfieldsnum;
    goto LAB_002539e4;
  case RNN_TTYPE_ENUM:
    pprStack_48 = ti->eenum->vals;
    bitfields._4_4_ = ti->eenum->valsnum;
LAB_002538fb:
    for (vals._4_4_ = 0; vals._4_4_ < bitfields._4_4_; vals._4_4_ = vals._4_4_ + 1) {
      iVar2 = rnndec_varmatch((rnndeccontext *)ti_local,&pprStack_48[vals._4_4_]->varinfo);
      if (((iVar2 != 0) && (pprStack_48[vals._4_4_]->valvalid != 0)) &&
         (pprStack_48[vals._4_4_]->value == uStack_28)) {
        asprintf((char **)&stack0xffffffffffffffc8,"%s%s%s",ti_local->ebitset->fullname,
                 pprStack_48[vals._4_4_]->name,ti_local->ebitset->name);
        return (char *)prStack_38;
      }
    }
  default:
switchD_002538c3_default:
    asprintf((char **)&stack0xffffffffffffffc8,"%s%#lx%s",(ti_local->ebitset->varinfo).prefix,
             uStack_28,ti_local->ebitset->name);
    ctx_local = prStack_38;
    break;
  case RNN_TTYPE_BITSET:
    pprStack_58 = ti->ebitset->bitfields;
    tmp._4_4_ = ti->ebitset->bitfieldsnum;
LAB_002539e4:
    sval = 0;
    for (vals._4_4_ = 0; vals._4_4_ < tmp._4_4_; vals._4_4_ = vals._4_4_ + 1) {
      iVar2 = rnndec_varmatch((rnndeccontext *)ti_local,&pprStack_58[vals._4_4_]->varinfo);
      if (iVar2 != 0) {
        value_00 = (uStack_28 & pprStack_58[vals._4_4_]->mask) >>
                   ((byte)pprStack_58[vals._4_4_]->low & 0x3f);
        sval = pprStack_58[vals._4_4_]->mask | sval;
        if ((pprStack_58[vals._4_4_]->typeinfo).type == RNN_TTYPE_BOOLEAN) {
          if (value_00 != 0) {
            if (value_00 != 1) goto LAB_00253b28;
            if (prStack_38 == (rnndeccontext *)0x0) {
              asprintf((char **)&stack0xffffffffffffffc8,"%s%s%s",
                       (ti_local->ebitset->varinfo).varsetstr,pprStack_58[vals._4_4_]->name,
                       ti_local->ebitset->name);
            }
            else {
              asprintf((char **)&mask,"%s | %s%s%s",prStack_38,
                       (ti_local->ebitset->varinfo).varsetstr,pprStack_58[vals._4_4_]->name,
                       ti_local->ebitset->name);
              free(prStack_38);
              prStack_38 = (rnndeccontext *)mask;
            }
          }
        }
        else {
LAB_00253b28:
          pcVar3 = rnndec_decodeval((rnndeccontext *)ti_local,&pprStack_58[vals._4_4_]->typeinfo,
                                    value_00,(pprStack_58[vals._4_4_]->high -
                                             pprStack_58[vals._4_4_]->low) + 1);
          if (prStack_38 == (rnndeccontext *)0x0) {
            asprintf((char **)&stack0xffffffffffffffc8,"%s%s%s = %s",
                     (ti_local->ebitset->varinfo).prefixstr,pprStack_58[vals._4_4_]->name,
                     ti_local->ebitset->name,pcVar3);
          }
          else {
            asprintf((char **)&mask,"%s | %s%s%s = %s",prStack_38,
                     (ti_local->ebitset->varinfo).prefixstr,pprStack_58[vals._4_4_]->name,
                     ti_local->ebitset->name,pcVar3);
            free(prStack_38);
            prStack_38 = (rnndeccontext *)mask;
          }
          free(pcVar3);
        }
      }
    }
    if ((uStack_28 & (sval ^ 0xffffffffffffffff)) != 0) {
      if (prStack_38 == (rnndeccontext *)0x0) {
        asprintf((char **)&stack0xffffffffffffffc8,"%s%#lx%s",ti_local->ebitset[1].name,
                 uStack_28 & (sval ^ 0xffffffffffffffff),ti_local->ebitset->name);
      }
      else {
        asprintf((char **)&mask,"%s | %s%#lx%s",prStack_38,ti_local->ebitset[1].name,
                 uStack_28 & (sval ^ 0xffffffffffffffff),ti_local->ebitset->name);
        free(prStack_38);
        prStack_38 = (rnndeccontext *)mask;
      }
    }
    if (prStack_38 == (rnndeccontext *)0x0) {
      asprintf((char **)&stack0xffffffffffffffc8,"%s0%s",(ti_local->ebitset->varinfo).prefix,
               ti_local->ebitset->name);
    }
    asprintf((char **)&mask,"{ %s }",prStack_38);
    free(prStack_38);
    ctx_local = (rnndeccontext *)mask;
    break;
  case RNN_TTYPE_SPECTYPE:
    ctx_local = (rnndeccontext *)rnndec_decodeval(ctx,&ti->spectype->typeinfo,uStack_28,width);
    break;
  case RNN_TTYPE_HEX:
    asprintf((char **)&stack0xffffffffffffffc8,"%s%#lx%s",ctx->colors->num,uStack_28,
             ctx->colors->reset);
    ctx_local = prStack_38;
    break;
  case RNN_TTYPE_INT:
    if ((uStack_28 & 1L << (bVar1 - 1 & 0x3f)) == 0) {
      asprintf((char **)&stack0xffffffffffffffc8,"%s%li%s",ctx->colors->num,uStack_28,
               ctx->colors->reset);
    }
    else {
      asprintf((char **)&stack0xffffffffffffffc8,"%s-%li%s",ctx->colors->num,
               (1L << (bVar1 & 0x3f)) - uStack_28,ctx->colors->reset);
    }
    ctx_local = prStack_38;
    break;
  case RNN_TTYPE_UINT:
    asprintf((char **)&stack0xffffffffffffffc8,"%s%lu%s",ctx->colors->num,uStack_28,
             ctx->colors->reset);
    ctx_local = prStack_38;
    break;
  case RNN_TTYPE_BOOLEAN:
    if (uStack_28 == 0) {
      asprintf((char **)&stack0xffffffffffffffc8,"%sFALSE%s",ctx->colors->eval,ctx->colors->reset);
      return (char *)prStack_38;
    }
    if (uStack_28 == 1) {
      asprintf((char **)&stack0xffffffffffffffc8,"%sTRUE%s",ctx->colors->eval,ctx->colors->reset);
      return (char *)prStack_38;
    }
  case RNN_TTYPE_FLOAT:
    if (width == 0x40) {
      asprintf((char **)&stack0xffffffffffffffc8,"%s%f%s",uStack_28,ctx->colors->num,
               ctx->colors->reset);
      return (char *)prStack_38;
    }
    if (width == 0x20) {
      asprintf((char **)&stack0xffffffffffffffc8,"%s%f%s",(double)(float)uStack_28,ctx->colors->num,
               ctx->colors->reset);
      return (char *)prStack_38;
    }
    if (width == 0x10) {
      pcVar3 = ctx->colors->num;
      fVar5 = float16((uint16_t)uStack_28);
      asprintf((char **)&stack0xffffffffffffffc8,"%s%f%s",(double)fVar5,pcVar3,
               ti_local->ebitset->name);
      return (char *)prStack_38;
    }
    goto switchD_002538c3_default;
  case RNN_TTYPE_FIXED:
    if ((uStack_28 & 1L << (bVar1 - 1 & 0x3f)) != 0) {
      lVar4 = (1L << (bVar1 & 0x3f)) - uStack_28;
      auVar6._8_4_ = (int)((ulong)lVar4 >> 0x20);
      auVar6._0_8_ = lVar4;
      auVar6._12_4_ = 0x45300000;
      asprintf((char **)&stack0xffffffffffffffc8,"%s-%lf%s (%08lx)",
               ((auVar6._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) /
               (double)(1 << ((byte)ti->radix & 0x1f)),ctx->colors->num,ctx->colors->reset,uStack_28
              );
      return (char *)prStack_38;
    }
  case RNN_TTYPE_UFIXED:
    auVar7._8_4_ = (int)(uStack_28 >> 0x20);
    auVar7._0_8_ = uStack_28;
    auVar7._12_4_ = 0x45300000;
    asprintf((char **)&stack0xffffffffffffffc8,"%s%lf%s (%08lx)",
             ((auVar7._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(float)uStack_28) - 4503599627370496.0)) /
             (double)(1 << ((byte)ti->radix & 0x1f)),ctx->colors->num,ctx->colors->reset,uStack_28);
    ctx_local = prStack_38;
  }
  return (char *)ctx_local;
}

Assistant:

char *rnndec_decodeval(struct rnndeccontext *ctx, struct rnntypeinfo *ti, uint64_t value, int width) {
	char *res = 0;
	int i;
	struct rnnvalue **vals;
	int valsnum;
	struct rnnbitfield **bitfields;
	int bitfieldsnum;
	char *tmp;
	uint64_t mask;
	if (!ti)
		goto failhex;
	if (ti->shr) value <<= ti->shr;
	if (ti->add) value += ti->add;
	switch (ti->type) {
		case RNN_TTYPE_ENUM:
			vals = ti->eenum->vals;
			valsnum = ti->eenum->valsnum;
			goto doenum;
		case RNN_TTYPE_INLINE_ENUM:
			vals = ti->vals;
			valsnum = ti->valsnum;
			goto doenum;
		doenum:
			for (i = 0; i < valsnum; i++)
				if (rnndec_varmatch(ctx, &vals[i]->varinfo) && vals[i]->valvalid && vals[i]->value == value) {
					asprintf (&res, "%s%s%s", ctx->colors->eval, vals[i]->name, ctx->colors->reset);
					return res;
				}
			goto failhex;
		case RNN_TTYPE_BITSET:
			bitfields = ti->ebitset->bitfields;
			bitfieldsnum = ti->ebitset->bitfieldsnum;
			goto dobitset;
		case RNN_TTYPE_INLINE_BITSET:
			bitfields = ti->bitfields;
			bitfieldsnum = ti->bitfieldsnum;
			goto dobitset;
		dobitset:
			mask = 0;
			for (i = 0; i < bitfieldsnum; i++) {
				if (!rnndec_varmatch(ctx, &bitfields[i]->varinfo))
					continue;
				uint64_t sval = (value & bitfields[i]->mask) >> bitfields[i]->low;
				mask |= bitfields[i]->mask;
				if (bitfields[i]->typeinfo.type == RNN_TTYPE_BOOLEAN) {
					if (sval == 0)
						continue;
					else if (sval == 1) {
						if (!res)
							asprintf (&res, "%s%s%s", ctx->colors->mod, bitfields[i]->name, ctx->colors->reset);
						else {
							asprintf (&tmp, "%s | %s%s%s", res, ctx->colors->mod, bitfields[i]->name, ctx->colors->reset);
							free(res);
							res = tmp;
						}
						continue;
					}
				}
				char *subval = rnndec_decodeval(ctx, &bitfields[i]->typeinfo, sval, bitfields[i]->high - bitfields[i]->low + 1);
				if (!res)
					asprintf (&res, "%s%s%s = %s", ctx->colors->rname, bitfields[i]->name, ctx->colors->reset, subval);
				else {
					asprintf (&tmp, "%s | %s%s%s = %s", res, ctx->colors->rname, bitfields[i]->name, ctx->colors->reset, subval);
					free(res);
					res = tmp;
				}
				free(subval);
			}
			if (value & ~mask) {
				if (!res)
					asprintf (&res, "%s%#"PRIx64"%s", ctx->colors->err, value & ~mask, ctx->colors->reset);
				else {
					asprintf (&tmp, "%s | %s%#"PRIx64"%s", res, ctx->colors->err, value & ~mask, ctx->colors->reset);
					free(res);
					res = tmp;
				}
			}
			if (!res)
				asprintf (&res, "%s0%s", ctx->colors->num, ctx->colors->reset);
			asprintf (&tmp, "{ %s }", res);
			free(res);
			return tmp;
		case RNN_TTYPE_SPECTYPE:
			return rnndec_decodeval(ctx, &ti->spectype->typeinfo, value, width);
		case RNN_TTYPE_HEX:
			asprintf (&res, "%s%#"PRIx64"%s", ctx->colors->num, value, ctx->colors->reset);
			return res;
		case RNN_TTYPE_FIXED:
			if (value & UINT64_C(1) << (width-1)) {
				asprintf (&res, "%s-%lf%s (%08"PRIx64")", ctx->colors->num,
						((double)((UINT64_C(1) << width) - value)) / ((double)(1 << ti->radix)),
						ctx->colors->reset, value);
				return res;
			}
			/* fallthrough */
		case RNN_TTYPE_UFIXED:
			asprintf (&res, "%s%lf%s (%08"PRIx64")", ctx->colors->num,
					((double)value) / ((double)(1 << ti->radix)),
					ctx->colors->reset, value);
			return res;
		case RNN_TTYPE_UINT:
			asprintf (&res, "%s%"PRIu64"%s", ctx->colors->num, value, ctx->colors->reset);
			return res;
		case RNN_TTYPE_INT:
			if (value & UINT64_C(1) << (width-1))
				asprintf (&res, "%s-%"PRIi64"%s", ctx->colors->num, (UINT64_C(1) << width) - value, ctx->colors->reset);
			else
				asprintf (&res, "%s%"PRIi64"%s", ctx->colors->num, value, ctx->colors->reset);
			return res;
		case RNN_TTYPE_BOOLEAN:
			if (value == 0) {
				asprintf (&res, "%sFALSE%s", ctx->colors->eval, ctx->colors->reset);
				return res;
			} else if (value == 1) {
				asprintf (&res, "%sTRUE%s", ctx->colors->eval, ctx->colors->reset);
				return res;
			}
		case RNN_TTYPE_FLOAT: {
			union { uint64_t i; float f; double d; } val;
			val.i = value;
			if (width == 64)
				asprintf(&res, "%s%f%s", ctx->colors->num,
					val.d, ctx->colors->reset);
			else if (width == 32)
				asprintf(&res, "%s%f%s", ctx->colors->num,
					val.f, ctx->colors->reset);
			else if (width == 16)
				asprintf(&res, "%s%f%s", ctx->colors->num,
					float16(value), ctx->colors->reset);
			else
				goto failhex;

			return res;
		}
		failhex:
		default:
			asprintf (&res, "%s%#"PRIx64"%s", ctx->colors->num, value, ctx->colors->reset);
			return res;
			break;
	}
}